

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O3

vector<char16_t,_std::allocator<char16_t>_> * __thiscall
RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_>::get_remainder
          (vector<char16_t,_std::allocator<char16_t>_> *__return_storage_ptr__,
          RandomTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *this,
          size_t in_times_split)

{
  pointer pvVar1;
  ulong uVar2;
  long lVar3;
  
  (__return_storage_ptr__->super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar1 = (this->m_tokens).
           super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_tokens).
                 super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
          -0x5555555555555555;
  if (in_times_split <= uVar2 && uVar2 - in_times_split != 0) {
    lVar3 = in_times_split * 0x18 + 8;
    do {
      std::vector<char16_t,std::allocator<char16_t>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<char16_t*,std::vector<char16_t,std::allocator<char16_t>>>>
                ((vector<char16_t,std::allocator<char16_t>> *)__return_storage_ptr__,
                 (__return_storage_ptr__->super__Vector_base<char16_t,_std::allocator<char16_t>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
                 *(undefined8 *)((long)pvVar1 + lVar3 + -8),
                 *(undefined8 *)
                  ((long)&(pvVar1->super__Vector_base<char16_t,_std::allocator<char16_t>_>)._M_impl.
                          super__Vector_impl_data + lVar3));
      in_times_split = in_times_split + 1;
      pvVar1 = (this->m_tokens).
               super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = ((long)(this->m_tokens).
                     super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
              -0x5555555555555555;
      if (in_times_split < uVar2) {
        std::vector<char16_t,std::allocator<char16_t>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<char16_t*,std::vector<char16_t,std::allocator<char16_t>>>>
                  ((vector<char16_t,std::allocator<char16_t>> *)__return_storage_ptr__,
                   (__return_storage_ptr__->super__Vector_base<char16_t,_std::allocator<char16_t>_>)
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (this->m_delim).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   (this->m_delim).super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        pvVar1 = (this->m_tokens).
                 super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar2 = ((long)(this->m_tokens).
                       super__Vector_base<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1 >> 3) *
                -0x5555555555555555;
      }
      lVar3 = lVar3 + 0x18;
    } while (in_times_split < uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		while (in_times_split < m_tokens.size()) {
			auto& token = m_tokens[in_times_split];
			result.insert(result.end(), token.begin(), token.end());
			++in_times_split;
			if (in_times_split < m_tokens.size()) {
				result.insert(result.end(), m_delim.begin(), m_delim.end());
			}
		}

		return result;
	}